

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpserver.c
# Opt level: O2

void print_usage(char *prg)

{
  fprintf(_stderr,"\nUsage: %s -l <port> -s <can_id> -d <can_id> [options] <CAN interface>\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("ip addressing:\n",0xf,1,_stderr);
  fwrite("         -l <port>    * (local port for the server)\n",0x34,1,_stderr);
  fputc(10,_stderr);
  fwrite("isotp addressing:\n",0x12,1,_stderr);
  fwrite("         -s <can_id>  * (source can_id. Use 8 digits for extended IDs)\n",0x47,1,_stderr);
  fwrite("         -d <can_id>  * (destination can_id. Use 8 digits for extended IDs)\n",0x4c,1,
         _stderr);
  fwrite("         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n",0x4c,1,
         _stderr);
  fwrite("         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n",0x46,1,_stderr);
  fputc(10,_stderr);
  fwrite("padding:\n",9,1,_stderr);
  fwrite("         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n",0x3c,1,_stderr);
  fwrite("         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n",0x47,1,_stderr);
  fputc(10,_stderr);
  fwrite("rx path:\n (config, which is sent to the sender / data source)\n",0x3e,1,_stderr);
  fwrite("         -b <bs>       (blocksize. 0 = off)\n",0x2c,1,_stderr);
  fwrite("         -m <val>      (STmin in ms/ns. See spec.)\n",0x33,1,_stderr);
  fwrite("         -w <num>      (max. wait frame transmissions)\n",0x37,1,_stderr);
  fputc(10,_stderr);
  fwrite("tx path:\n (config, which changes local tx settings)\n",0x34,1,_stderr);
  fwrite("         -t <time ns>  (transmit time in nanosecs)\n",0x33,1,_stderr);
  fputc(10,_stderr);
  fwrite("(* = mandatory option)\n",0x17,1,_stderr);
  fputc(10,_stderr);
  fwrite("All values except for \'-l\' and \'-t\' are expected in hexadecimal values.\n",0x48,1,
         _stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s -l <port> -s <can_id> -d <can_id> [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "ip addressing:\n");
	fprintf(stderr, "         -l <port>    * (local port for the server)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "isotp addressing:\n");
	fprintf(stderr, "         -s <can_id>  * (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  * (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "padding:\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "rx path:\n (config, which is sent to the sender / data source)\n");
	fprintf(stderr, "         -b <bs>       (blocksize. 0 = off)\n");
	fprintf(stderr, "         -m <val>      (STmin in ms/ns. See spec.)\n");
	fprintf(stderr, "         -w <num>      (max. wait frame transmissions)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "tx path:\n (config, which changes local tx settings)\n");
	fprintf(stderr, "         -t <time ns>  (transmit time in nanosecs)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "(* = mandatory option)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "All values except for '-l' and '-t' are expected in hexadecimal values.\n");
	fprintf(stderr, "\n");
}